

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O1

QRectF * __thiscall QGraphicsView::sceneRect(QRectF *__return_storage_ptr__,QGraphicsView *this)

{
  long lVar1;
  qreal qVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  
  lVar1 = *(long *)(this + 8);
  if ((*(byte *)(lVar1 + 0x300) & 2) == 0) {
    if (((*(long *)(lVar1 + 0x490) != 0) && (*(int *)(*(long *)(lVar1 + 0x490) + 4) != 0)) &&
       (*(long *)(lVar1 + 0x498) != 0)) {
      QGraphicsScene::sceneRect(__return_storage_ptr__,*(QGraphicsScene **)(lVar1 + 0x498));
      return __return_storage_ptr__;
    }
    uVar3 = 0;
    uVar4 = 0;
    uVar5 = 0;
    uVar6 = 0;
    __return_storage_ptr__->w = 0.0;
    __return_storage_ptr__->h = 0.0;
  }
  else {
    uVar3 = *(undefined4 *)(lVar1 + 0x308);
    uVar4 = *(undefined4 *)(lVar1 + 0x30c);
    uVar5 = *(undefined4 *)(lVar1 + 0x310);
    uVar6 = *(undefined4 *)(lVar1 + 0x314);
    qVar2 = *(qreal *)(lVar1 + 800);
    __return_storage_ptr__->w = *(qreal *)(lVar1 + 0x318);
    __return_storage_ptr__->h = qVar2;
  }
  *(undefined4 *)&__return_storage_ptr__->xp = uVar3;
  *(undefined4 *)((long)&__return_storage_ptr__->xp + 4) = uVar4;
  *(undefined4 *)&__return_storage_ptr__->yp = uVar5;
  *(undefined4 *)((long)&__return_storage_ptr__->yp + 4) = uVar6;
  return __return_storage_ptr__;
}

Assistant:

QRectF QGraphicsView::sceneRect() const
{
    Q_D(const QGraphicsView);
    if (d->hasSceneRect)
        return d->sceneRect;
    if (d->scene)
        return d->scene->sceneRect();
    return QRectF();
}